

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupport.cpp
# Opt level: O2

bool __thiscall MockSupport::hasCallsOutOfOrder(MockSupport *this)

{
  bool bVar1;
  MockSupport *node;
  MockSupport *pMVar2;
  MockSupport *pMVar3;
  bool bVar4;
  
  bVar1 = MockExpectedCallsList::hasCallsOutOfOrder(&this->expectations_);
  bVar4 = true;
  if (!bVar1) {
    pMVar3 = (MockSupport *)&this->data_;
    for (node = (MockSupport *)MockNamedValueList::begin((MockNamedValueList *)pMVar3);
        bVar4 = node != (MockSupport *)0x0, bVar4;
        node = (MockSupport *)MockNamedValueListNode::next((MockNamedValueListNode *)node)) {
      pMVar2 = getMockSupport(pMVar3,(MockNamedValueListNode *)node);
      if (pMVar2 != (MockSupport *)0x0) {
        pMVar3 = getMockSupport(pMVar3,(MockNamedValueListNode *)node);
        bVar1 = hasCallsOutOfOrder(pMVar3);
        if (bVar1) {
          return bVar4;
        }
      }
      pMVar3 = node;
    }
  }
  return bVar4;
}

Assistant:

bool MockSupport::hasCallsOutOfOrder()
{
    if (expectations_.hasCallsOutOfOrder())
    {
        return true;
    }
    for (MockNamedValueListNode* p = data_.begin(); p; p = p->next())
        if (getMockSupport(p) && getMockSupport(p)->hasCallsOutOfOrder())
        {
            return true;
        }
    return false;
}